

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O0

void __thiscall Object::externalProjector(Object *this,Edge *src,Vector2d *obs)

{
  bool bVar1;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *ppVar2;
  const_reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  unsigned_long *in_RDI;
  size_t i_1;
  bool valid_flag;
  Edge *this_edge;
  size_t top;
  size_t i;
  HeapType heap;
  HeapType *in_stack_00000460;
  Edge *in_stack_00000468;
  Vector2d *in_stack_00000470;
  Edge *in_stack_00000478;
  Object *in_stack_00000480;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff50;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *this_00;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *this_01;
  EdgeCompFunctor *__x;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *in_stack_ffffffffffffff70;
  ulong uVar6;
  ulong __n;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *local_70;
  EdgeCompFunctor local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  local_40 [2];
  
  this_01 = local_40;
  EdgeCompFunctor::EdgeCompFunctor
            ((EdgeCompFunctor *)this_01,(vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 2));
  local_58.egs = (vector<Edge,_std::allocator<Edge>_> *)0x0;
  uStack_50 = 0;
  local_48 = 0;
  __x = &local_58;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x149e85);
  std::
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  ::priority_queue(in_stack_ffffffffffffff70,__x,&this_01->c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff50);
  local_70 = (priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
              *)0x0;
  while (this_00 = local_70,
        ppVar2 = (priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                  *)std::vector<Edge,_std::allocator<Edge>_>::size
                              ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 2)),
        this_00 < ppVar2) {
    std::
    priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,EdgeCompFunctor>
    ::emplace<unsigned_long&>(this_01,in_RDI);
    local_70 = (priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                *)((long)&(local_70->c).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + 1);
  }
  while (bVar1 = std::
                 priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                 ::empty((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                          *)0x149f48), !bVar1) {
    pvVar3 = std::
             priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
             ::top((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                    *)0x149f6d);
    pvVar4 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 2),*pvVar3);
    std::
    priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
    ::pop(this_00);
    if ((pvVar4->valid & 1U) != 0) {
      projectEdge2Edge(in_stack_00000480,in_stack_00000478,in_stack_00000470,in_stack_00000468,
                       in_stack_00000460);
    }
  }
  bVar1 = false;
  uVar6 = 0;
  do {
    __n = uVar6;
    sVar5 = std::vector<Edge,_std::allocator<Edge>_>::size
                      ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 2));
    if (sVar5 <= uVar6) {
LAB_0014a057:
      if (!bVar1) {
        *(undefined1 *)((long)in_RDI + 4) = 0;
      }
      std::
      priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
      ::~priority_queue((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                         *)0x14a07b);
      return;
    }
    pvVar4 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 2),__n);
    if ((pvVar4->valid & 1U) == 1) {
      bVar1 = true;
      goto LAB_0014a057;
    }
    uVar6 = __n + 1;
  } while( true );
}

Assistant:

void Object::externalProjector(Edge& src, const Eigen::Vector2d& obs) {
    HeapType heap(edges);
    for (size_t i = 0; i < edges.size(); i++)
        heap.emplace(i);
    while (heap.empty() == false) {
        size_t top = heap.top();
        Edge& this_edge = edges[top];
        heap.pop();
        if (this_edge.valid == false) continue;
        projectEdge2Edge(src, obs, this_edge, heap);
    }
    bool valid_flag = false;
    for (size_t i = 0; i < edges.size(); i++) {
        if (edges[i].valid == true) {
            valid_flag = true;
            break;
        }
    }
    if (valid_flag == false)                    // 假如全部被遮挡，那么这个object就没有投影的必要了
        valid = false;
}